

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void DecodeDistanceBlockSwitch(BrotliDecoderStateInternal *s)

{
  size_t *psVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  long *plVar5;
  uint *puVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t uVar11;
  HuffmanCode *pHVar12;
  HuffmanCode *pHVar13;
  ulong uVar14;
  
  uVar4 = s->num_block_types[2];
  if (1 < uVar4) {
    pHVar12 = s->block_type_trees;
    uVar8 = (s->br).bit_pos_;
    uVar10 = (s->br).val_;
    if (0x2f < uVar8) {
      (s->br).val_ = uVar10 >> 0x30;
      uVar8 = uVar8 ^ 0x30;
      (s->br).bit_pos_ = uVar8;
      plVar5 = (long *)(s->br).next_in;
      uVar10 = uVar10 >> 0x30 | *plVar5 << 0x10;
      (s->br).val_ = uVar10;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      (s->br).next_in = (uint8_t *)((long)plVar5 + 6);
    }
    uVar14 = uVar10 >> ((byte)uVar8 & 0x3f);
    pHVar12 = pHVar12 + (uVar14 & 0xff) + 0x4f0;
    bVar7 = pHVar12->bits;
    if (8 < bVar7) {
      uVar8 = uVar8 + 8;
      pHVar12 = pHVar12 + (((uint)(uVar14 >> 8) & 0xffffff & kBitMask[bVar7 - 8]) +
                          (uint)pHVar12->value);
      bVar7 = pHVar12->bits;
    }
    pHVar13 = s->block_len_trees;
    uVar8 = bVar7 + uVar8;
    uVar2 = pHVar12->value;
    if (0x2f < uVar8) {
      (s->br).val_ = uVar10 >> 0x30;
      plVar5 = (long *)(s->br).next_in;
      uVar10 = uVar10 >> 0x30 | *plVar5 << 0x10;
      (s->br).val_ = uVar10;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 6;
      uVar8 = uVar8 ^ 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar5 + 6);
    }
    uVar14 = uVar10 >> ((byte)uVar8 & 0x3f);
    pHVar13 = pHVar13 + (uVar14 & 0xff) + 0x318;
    uVar9 = (uint)pHVar13->bits;
    if (8 < uVar9) {
      uVar8 = uVar8 + 8;
      pHVar13 = pHVar13 + (((uint)(uVar14 >> 8) & 0xffffff & kBitMask[pHVar13->bits - 8]) +
                          (uint)pHVar13->value);
      uVar9 = (uint)pHVar13->bits;
    }
    uVar9 = uVar9 + uVar8;
    bVar7 = kBlockLengthPrefixCode[pHVar13->value].nbits;
    uVar3 = kBlockLengthPrefixCode[pHVar13->value].offset;
    if (0x1f < uVar9) {
      uVar9 = uVar9 ^ 0x20;
      (s->br).bit_pos_ = uVar9;
      puVar6 = (uint *)(s->br).next_in;
      uVar10 = uVar10 >> 0x20 | (ulong)*puVar6 << 0x20;
      (s->br).val_ = uVar10;
      psVar1 = &(s->br).avail_in;
      *psVar1 = *psVar1 - 4;
      (s->br).next_in = (uint8_t *)(puVar6 + 1);
    }
    uVar8 = kBitMask[(uint)bVar7];
    (s->br).bit_pos_ = uVar9 + bVar7;
    s->block_length[2] = ((uint)(uVar10 >> ((byte)uVar9 & 0x3f)) & uVar8) + (uint)uVar3;
    if (uVar2 == 0) {
      uVar11 = s->block_type_rb[4];
    }
    else if (uVar2 == 1) {
      uVar11 = s->block_type_rb[5] + 1;
    }
    else {
      uVar11 = uVar2 - 2;
    }
    uVar8 = 0;
    if (uVar4 <= uVar11) {
      uVar8 = uVar4;
    }
    s->block_type_rb[4] = s->block_type_rb[5];
    s->block_type_rb[5] = uVar11 - uVar8;
    s->dist_context_map_slice = s->dist_context_map + (uVar11 - uVar8) * 4;
    s->dist_htree_index = (s->dist_context_map + (uVar11 - uVar8) * 4)[s->distance_context];
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}